

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O1

void ssw_strip(char **str)

{
  long lVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *__src;
  long lVar5;
  
  pcVar4 = *str;
  sVar3 = strlen(pcVar4);
  lVar5 = 1;
  pcVar2 = pcVar4;
  do {
    __src = pcVar2;
    lVar5 = lVar5 + -1;
    pcVar2 = __src + 1;
  } while (*__src == ' ');
  if (lVar5 != 0) {
    memmove(pcVar4,__src,sVar3 + lVar5 + 1);
  }
  if ((ulong)-lVar5 < sVar3) {
    if ((*str)[sVar3 + lVar5 + -1] == ' ') {
      pcVar4 = *str + sVar3 + lVar5 + -1;
      lVar5 = sVar3 + lVar5 + -1;
      do {
        *pcVar4 = '\0';
        if (lVar5 == 0) {
          return;
        }
        pcVar4 = *str + lVar5 + -1;
        lVar1 = lVar5 + -1;
        lVar5 = lVar5 + -1;
      } while ((*str)[lVar1] == ' ');
    }
  }
  return;
}

Assistant:

void ssw_strip(char **str) {
  size_t l = strlen(*str);
  size_t i = 0;
  while ((*str)[i]==' ')
    ++i;
  if (i)
    memmove(*str,*str+i,l+1-i);
  if ( l <= i )
    return;
  i = (size_t)((l-i)-1);
  while ( (*str)[i]==' ' ) {
    (*str)[i]='\0';
    if (!i)
      break;
    --i;
  }
}